

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O2

void TIFFSwabLong(uint32_t *lp)

{
  uint32_t uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined1 auVar6 [16];
  
  uVar1 = *lp;
  auVar6 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(uVar1 >> 
                                                  0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(uVar1 >> 0x10),uVar1)) >> 0x20),
                                                  uVar1) >> 0x18),(char)(uVar1 >> 8)),
                            (ushort)(byte)uVar1) & 0xffffff00ffffff);
  auVar6 = pshuflw(auVar6,auVar6,0x1b);
  sVar2 = auVar6._0_2_;
  sVar3 = auVar6._2_2_;
  sVar4 = auVar6._4_2_;
  sVar5 = auVar6._6_2_;
  *lp = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar6[6] - (0xff < sVar5),
                 CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar6[4] - (0xff < sVar4),
                          CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar6[2] - (0xff < sVar3),
                                   (0 < sVar2) * (sVar2 < 0x100) * auVar6[0] - (0xff < sVar2))));
  return;
}

Assistant:

void TIFFSwabLong(uint32_t *lp)
{
    register unsigned char *cp = (unsigned char *)lp;
    unsigned char t;
    assert(sizeof(uint32_t) == 4);
    t = cp[3];
    cp[3] = cp[0];
    cp[0] = t;
    t = cp[2];
    cp[2] = cp[1];
    cp[1] = t;
}